

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::pushAndSubPrefix
          (AVisitor<hiberlite::ExtractModel> *this,string *prefix)

{
  string *psVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::push_back
            (&(this->stack).c,&this->scope);
  psVar1 = &(this->scope)._prefix;
  std::__cxx11::string::string((string *)&bStack_48,(string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_48);
  if (bStack_48._M_string_length == 0) {
    std::__cxx11::string::append((string *)psVar1);
  }
  else {
    std::operator+(&bStack_48,"_",prefix);
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  piVar2 = &(this->scope).prefix_depth;
  *piVar2 = *piVar2 + 1;
  return;
}

Assistant:

void AVisitor<C>::pushAndSubPrefix(std::string prefix)
{
	stack.push(scope);
	if(scope.prefix().size())
		scope._prefix+="_"+prefix;
	else
		scope._prefix+=prefix;
	scope.prefix_depth++;
}